

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::asio_service::schedule(asio_service *this,ptr<delayed_task> *task,int32 milliseconds)

{
  element_type *peVar1;
  void *pvVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  steady_timer *timer;
  io_context *in_stack_ffffffffffffff38;
  _Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>
  *token;
  function<void_(void_*)> *in_stack_ffffffffffffff40;
  _func_void_void_ptr **in_stack_ffffffffffffff48;
  delayed_task *in_stack_ffffffffffffff50;
  duration *in_stack_ffffffffffffff58;
  element_type *in_stack_ffffffffffffff60;
  _Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>
  local_68;
  code *local_50;
  duration local_48 [6];
  int local_14 [5];
  
  peVar1 = std::__shared_ptr_access<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b79d8);
  pvVar2 = delayed_task::get_impl_context(peVar1);
  if (pvVar2 == (void *)0x0) {
    in_stack_ffffffffffffff60 =
         std::__shared_ptr_access<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x1b79f7);
    operator_new(0x78);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::basic_waitable_timer<asio::io_context>
              ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0);
    local_50 = _free_timer_;
    in_stack_ffffffffffffff58 = local_48;
    std::function<void(void*)>::function<void(*)(void*),void>
              ((function<void_(void_*)> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    delayed_task::set_impl_context
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x1b7a69);
  }
  std::__shared_ptr_access<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b7ac1);
  delayed_task::reset((delayed_task *)0x1b7ac9);
  peVar1 = std::__shared_ptr_access<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b7ad6);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)delayed_task::get_impl_context(peVar1);
  token = &local_68;
  local_68._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
  super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)token,local_14);
  local_68._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
  super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       std::chrono::
       duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000l>>
                 ((duration<long,_std::ratio<1L,_1000L>_> *)token);
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::expires_after((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                   *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::
  bind<void(*)(std::shared_ptr<nuraft::delayed_task>&,std::error_code),std::shared_ptr<nuraft::delayed_task>&,std::_Placeholder<1>const&>
            ((_func_void_shared_ptr<nuraft::delayed_task>_ptr_error_code **)
             local_68._M_bound_args.
             super__Tuple_impl<0UL,_std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>_>.
             super__Head_base<0UL,_std::shared_ptr<nuraft::delayed_task>,_false>._M_head_impl.
             super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             (shared_ptr<nuraft::delayed_task> *)this_00,(_Placeholder<1> *)token);
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
  ::
  async_wait<std::_Bind<void(*(std::shared_ptr<nuraft::delayed_task>,std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>&,std::error_code)>>
            ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
              *)this_00,token);
  std::
  _Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>
  ::~_Bind((_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>
            *)0x1b7b74);
  return;
}

Assistant:

void asio_service::schedule(ptr<delayed_task>& task, int32 milliseconds) {
    if (task->get_impl_context() == nilptr) {
        task->set_impl_context( new asio::steady_timer(impl_->io_svc_),
                                &_free_timer_ );
    }
    // ensure it's not in cancelled state
    task->reset();

    asio::steady_timer* timer = static_cast<asio::steady_timer*>
                                ( task->get_impl_context() );
    timer->expires_after
           ( std::chrono::duration_cast<std::chrono::nanoseconds>
             ( std::chrono::milliseconds(milliseconds) ) );
    timer->async_wait( std::bind( &_timer_handler_,
                                  task,
                                  std::placeholders::_1 ) );
}